

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsecheck.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  char *pcVar2;
  TuningError *t;
  string local_180 [32];
  KeyboardMapping local_160;
  allocator local_c1;
  string local_c0 [32];
  Scale local_a0;
  int local_20;
  int local_1c;
  char **ppcStack_18;
  int i;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  for (local_1c = 1; local_1c < (int)argv_local; local_1c = local_1c + 1) {
    local_20 = (int)std::setw(0x32);
    poVar1 = std::operator<<((ostream *)&std::cout,(_Setw)local_20);
    std::operator<<(poVar1,ppcStack_18[local_1c]);
    pcVar2 = strstr(ppcStack_18[local_1c],".scl");
    if (pcVar2 == (char *)0x0) {
      pcVar2 = strstr(ppcStack_18[local_1c],".kbm");
      if (pcVar2 == (char *)0x0) {
        std::operator<<((ostream *)&std::cout," SKIPPED");
      }
      else {
        pcVar2 = ppcStack_18[local_1c];
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_180,pcVar2,(allocator *)((long)&t + 7));
        Tunings::readKBMFile(&local_160,(string *)local_180);
        Tunings::KeyboardMapping::~KeyboardMapping(&local_160);
        std::__cxx11::string::~string(local_180);
        std::allocator<char>::~allocator((allocator<char> *)((long)&t + 7));
        std::operator<<((ostream *)&std::cout," PASSED");
      }
    }
    else {
      pcVar2 = ppcStack_18[local_1c];
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c0,pcVar2,&local_c1);
      Tunings::readSCLFile(&local_a0,(string *)local_c0);
      Tunings::Scale::~Scale(&local_a0);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
      std::operator<<((ostream *)&std::cout," PASSED");
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv)
{
    for (int i=1; i<argc; ++i)
    {
        std::cout << std::setw(50) << argv[i];
        try {
            if (strstr(argv[i], ".scl")) {
                Tunings::readSCLFile(argv[i]);
                std::cout << " PASSED";
            }
            else if (strstr(argv[i], ".kbm")) {
                Tunings::readKBMFile(argv[i]);
                std::cout << " PASSED";
            }
            else
            {
                std::cout << " SKIPPED";
            }

        } catch(Tunings::TuningError &t)
        {
            std::cout << " FAILED : " << t.what();
        }
        std::cout << std::endl;
    }
}